

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesNH41
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  ulong uVar2;
  ulong *puVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  BrotliEncoderDictionary *pBVar9;
  void *pvVar10;
  void *pvVar11;
  HasherCommon *pHVar12;
  BrotliDictionary *pBVar13;
  bool bVar14;
  ulong uVar15;
  ushort uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  size_t sVar23;
  ulong uVar24;
  uint8_t *puVar25;
  ulong *puVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  uint8_t *s1_orig_3;
  ulong *puVar31;
  ulong uVar32;
  ushort uVar33;
  ulong uVar34;
  bool bVar35;
  long lVar36;
  int iVar37;
  ulong uVar38;
  ulong uVar39;
  uint16_t uVar40;
  uint32_t uVar41;
  uint uVar42;
  ulong uVar43;
  long lVar44;
  uint8_t *s1_orig_4;
  long lVar45;
  ulong uVar46;
  long lVar47;
  uint8_t *puVar48;
  ulong uVar49;
  char cVar50;
  uint uVar51;
  uint uVar52;
  ulong *puVar53;
  uint8_t *s1_orig_1;
  uint8_t *puVar54;
  size_t sVar55;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_138;
  int local_10c;
  size_t local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  Command *local_d8;
  uint local_c8;
  int local_c4;
  ulong local_b8;
  ulong local_b0;
  
  iVar28 = params->lgwin;
  sVar7 = params->stream_offset;
  uVar6 = (position - 3) + num_bytes;
  sVar23 = position;
  if (3 < num_bytes) {
    sVar23 = uVar6;
  }
  lVar45 = 0x200;
  if (params->quality < 9) {
    lVar45 = 0x40;
  }
  local_100 = *last_insert_len;
  sVar8 = (params->dictionary).compound.total_size;
  iVar37 = *dist_cache;
  dist_cache[4] = iVar37 + -1;
  dist_cache[5] = iVar37 + 1;
  dist_cache[6] = iVar37 + -2;
  dist_cache[7] = iVar37 + 2;
  *(ulong *)(dist_cache + 8) = CONCAT44(iVar37 + 3,iVar37 + -3);
  uVar2 = position + num_bytes;
  if (uVar2 <= position + 4) {
    local_d8 = commands;
LAB_01bee623:
    *last_insert_len = (local_100 + uVar2) - position;
    *num_commands = *num_commands + ((long)local_d8 - (long)commands >> 4);
    return;
  }
  uVar43 = (1L << ((byte)iVar28 & 0x3f)) - 0x10;
  uVar20 = lVar45 + position;
  lVar1 = sVar8 + 1;
  lVar5 = position - 1;
  local_d8 = commands;
  uVar30 = position;
LAB_01bed238:
  uVar29 = uVar43;
  if (uVar30 < uVar43) {
    uVar29 = uVar30;
  }
  uVar21 = sVar7 + uVar30;
  if (uVar43 <= sVar7 + uVar30) {
    uVar21 = uVar43;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_c8 = 0;
    local_b0 = 0;
    goto LAB_01bed2c7;
  }
  if (uVar30 == 0) {
    local_b0 = 0;
LAB_01bed2a2:
    uVar49 = 0;
  }
  else {
    local_b0 = (ulong)ringbuffer[uVar30 - 1 & ringbuffer_mask];
    if (uVar30 == 1) goto LAB_01bed2a2;
    uVar49 = (ulong)ringbuffer[uVar30 - 2 & ringbuffer_mask];
  }
  local_c8 = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar49 + 0x100] | literal_context_lut[local_b0]];
LAB_01bed2c7:
  local_138 = uVar2 - uVar30;
  pBVar9 = (params->dictionary).contextual.dict[local_c8];
  uVar49 = (params->dist).max_distance;
  pvVar10 = (hasher->privat)._H40.extra[0];
  pvVar11 = (hasher->privat)._H40.extra[1];
  uVar17 = uVar30 & ringbuffer_mask;
  puVar3 = (ulong *)(ringbuffer + uVar17);
  uVar51 = (uint)(*(int *)(ringbuffer + uVar17) * 0x1e35a7bd) >> 0x11;
  local_f8 = 0x7e4;
  uVar46 = 0;
  lVar36 = 0;
  uVar19 = 0;
  local_168 = 0;
LAB_01bed339:
  uVar38 = (ulong)dist_cache[lVar36];
  uVar24 = uVar30 - uVar38;
  cVar50 = (char)uVar51;
  if ((((lVar36 == 0) || (*(char *)((long)pvVar10 + (uVar24 & 0xffff) + 0x30000) == cVar50)) &&
      (uVar38 <= uVar29)) && (uVar24 < uVar30)) {
    puVar25 = ringbuffer + (uVar24 & ringbuffer_mask);
    uVar24 = local_138;
    puVar31 = puVar3;
    puVar54 = puVar25;
    if (7 < local_138) {
      lVar44 = 0;
      lVar18 = 0;
LAB_01bed397:
      if (*(ulong *)((long)puVar3 + lVar44) == *(ulong *)(puVar25 + lVar44)) goto code_r0x01bed3a4;
      uVar34 = *(ulong *)(puVar25 + lVar44) ^ *(ulong *)((long)puVar3 + lVar44);
      uVar24 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
      uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar18;
      goto LAB_01bed41b;
    }
    goto LAB_01bed3d5;
  }
  goto LAB_01bed466;
code_r0x01bed3a4:
  lVar44 = lVar44 + 8;
  lVar47 = local_138 + lVar18;
  lVar18 = lVar18 + -8;
  if (lVar47 - 8U < 8) goto code_r0x01bed3bf;
  goto LAB_01bed397;
code_r0x01bed3bf:
  puVar54 = puVar25 + -lVar18;
  puVar31 = (ulong *)((long)puVar3 - lVar18);
  uVar24 = lVar18 + local_138;
LAB_01bed3d5:
  if (uVar24 != 0) {
    uVar34 = 0;
    do {
      uVar39 = uVar34;
      if (puVar54[uVar34] != *(uint8_t *)((long)puVar31 + uVar34)) break;
      uVar34 = uVar34 + 1;
      uVar39 = uVar24;
    } while (uVar24 != uVar34);
    puVar54 = puVar54 + uVar39;
  }
  uVar24 = (long)puVar54 - (long)puVar25;
LAB_01bed41b:
  if ((1 < uVar24) && (uVar34 = uVar24 * 0x87 + 0x78f, local_f8 < uVar34)) {
    if (lVar36 != 0) {
      uVar34 = uVar34 - ((0x1ca10U >> ((byte)lVar36 & 0xe) & 0xe) + 0x27);
    }
    if (local_f8 < uVar34) {
      uVar19 = uVar24;
      uVar46 = uVar24;
      local_168 = uVar38;
      local_f8 = uVar34;
    }
  }
LAB_01bed466:
  lVar36 = lVar36 + 1;
  if (lVar36 == 10) goto code_r0x01bed473;
  goto LAB_01bed339;
code_r0x01bed473:
  uVar24 = (ulong)uVar51;
  sVar55 = (hasher->privat)._H5.block_size_;
  uVar38 = uVar30 - *(uint *)((long)pvVar10 + uVar24 * 4);
  if (sVar55 != 0) {
    uVar33 = *(ushort *)((long)pvVar10 + uVar24 * 2 + 0x20000);
    uVar39 = 0;
    uVar34 = uVar38;
LAB_01bed4b2:
    uVar39 = uVar34 + uVar39;
    if (uVar39 <= uVar29) {
      if (uVar17 + uVar46 <= ringbuffer_mask) {
        uVar32 = uVar30 - uVar39 & ringbuffer_mask;
        uVar34 = uVar32 + uVar46;
        if ((ringbuffer_mask < uVar34) || (ringbuffer[uVar17 + uVar46] != ringbuffer[uVar34]))
        goto LAB_01bed5db;
        puVar25 = ringbuffer + uVar32;
        puVar54 = puVar25;
        uVar34 = local_138;
        puVar31 = puVar3;
        if (7 < local_138) {
          lVar36 = 0;
          lVar18 = 0;
LAB_01bed51c:
          if (*(ulong *)((long)puVar3 + lVar36) == *(ulong *)(puVar25 + lVar36))
          goto code_r0x01bed529;
          uVar32 = *(ulong *)(puVar25 + lVar36) ^ *(ulong *)((long)puVar3 + lVar36);
          uVar34 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
            }
          }
          uVar34 = (uVar34 >> 3 & 0x1fffffff) - lVar18;
          goto LAB_01bed5a8;
        }
        goto LAB_01bed559;
      }
      goto LAB_01bed5db;
    }
  }
LAB_01bed5f7:
  uVar33 = (hasher->privat)._H42.free_slot_idx[0];
  (hasher->privat)._H42.free_slot_idx[0] = uVar33 + 1;
  if (0xfffe < uVar38) {
    uVar38 = 0xffff;
  }
  *(char *)((long)pvVar10 + (uVar30 & 0xffff) + 0x30000) = cVar50;
  *(short *)((long)pvVar11 + (ulong)uVar33 * 4) = (short)uVar38;
  *(undefined2 *)((long)pvVar11 + (ulong)uVar33 * 4 + 2) =
       *(undefined2 *)((long)pvVar10 + uVar24 * 2 + 0x20000);
  *(int *)((long)pvVar10 + uVar24 * 4) = (int)uVar30;
  *(ushort *)((long)pvVar10 + uVar24 * 2 + 0x20000) = uVar33;
  if (local_f8 == 0x7e4) {
    pHVar12 = (hasher->privat)._H5.common_;
    uVar29 = pHVar12->dict_num_lookups;
    local_f0 = pHVar12->dict_num_matches;
    if (uVar29 >> 7 <= local_f0) {
      uVar46 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar54 = pBVar9->hash_table_lengths;
      local_f8 = 0x7e4;
      local_10c = 0;
      bVar35 = true;
LAB_01bed6c2:
      uVar29 = uVar29 + 1;
      pHVar12->dict_num_lookups = uVar29;
      bVar22 = puVar54[uVar46];
      uVar17 = (ulong)bVar22;
      if ((uVar17 != 0) && (uVar17 <= local_138)) {
        pBVar13 = pBVar9->words;
        puVar26 = (ulong *)(pBVar13->data +
                           (ulong)pBVar13->offsets_by_length[uVar17] +
                           pBVar9->hash_table_words[uVar46] * uVar17);
        puVar31 = puVar3;
        uVar24 = uVar17;
        if (7 < bVar22) {
          lVar36 = 0;
LAB_01bed71e:
          if (*puVar26 == *puVar31) goto code_r0x01bed729;
          uVar38 = *puVar31 ^ *puVar26;
          uVar24 = 0;
          if (uVar38 != 0) {
            for (; (uVar38 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
            }
          }
          uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar36;
          goto LAB_01bed7af;
        }
        goto LAB_01bed750;
      }
      goto LAB_01bed85a;
    }
  }
  else {
    local_10c = 0;
LAB_01bed889:
    if (0x7e4 < local_f8) {
      uVar20 = local_100 + 4;
      lVar36 = (lVar5 + num_bytes) - uVar30;
      local_c4 = 0;
      uVar33 = (hasher->privat)._H42.free_slot_idx[0];
LAB_01bed8e3:
      local_138 = local_138 - 1;
      local_158 = uVar19 - 1;
      if (local_138 <= uVar19 - 1) {
        local_158 = local_138;
      }
      if (4 < params->quality) {
        local_158 = 0;
      }
      uVar29 = uVar30 + 1;
      uVar21 = uVar43;
      if (uVar29 < uVar43) {
        uVar21 = uVar29;
      }
      local_b8 = sVar7 + uVar30 + 1;
      if (uVar43 <= local_b8) {
        local_b8 = uVar43;
      }
      if ((params->dictionary).contextual.context_based != 0) {
        local_c8 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[local_b0 + 0x100] |
                          literal_context_lut[ringbuffer[uVar30 & ringbuffer_mask]]];
        local_b0 = (ulong)ringbuffer[uVar30 & ringbuffer_mask];
      }
      pBVar9 = (params->dictionary).contextual.dict[local_c8];
      uVar49 = (params->dist).max_distance;
      pvVar10 = (hasher->privat)._H40.extra[0];
      pvVar11 = (hasher->privat)._H40.extra[1];
      uVar17 = uVar29 & ringbuffer_mask;
      puVar3 = (ulong *)(ringbuffer + uVar17);
      uVar51 = (uint)(*(int *)(ringbuffer + uVar17) * 0x1e35a7bd) >> 0x11;
      uVar46 = 0x7e4;
      lVar18 = 0;
      local_160 = 0;
      local_150 = 0;
LAB_01beda05:
      uVar38 = (ulong)dist_cache[lVar18];
      uVar24 = uVar29 - uVar38;
      cVar50 = (char)uVar51;
      if (((lVar18 == 0) || (*(char *)((long)pvVar10 + (uVar24 & 0xffff) + 0x30000) == cVar50)) &&
         ((uVar38 <= uVar21 && (uVar24 < uVar29)))) {
        puVar25 = ringbuffer + (uVar24 & ringbuffer_mask);
        puVar31 = puVar3;
        puVar54 = puVar25;
        uVar24 = local_138;
        if (7 < local_138) {
          lVar44 = 0;
          lVar47 = 0;
LAB_01beda58:
          if (*(ulong *)((long)puVar3 + lVar44) == *(ulong *)(puVar25 + lVar44))
          goto code_r0x01beda65;
          uVar34 = *(ulong *)(puVar25 + lVar44) ^ *(ulong *)((long)puVar3 + lVar44);
          uVar24 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
            }
          }
          uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar47;
          goto LAB_01bedacf;
        }
        goto LAB_01beda8a;
      }
      goto LAB_01bedb26;
    }
  }
  local_100 = local_100 + 1;
  position = uVar30 + 1;
  if (position <= uVar20) goto LAB_01bee5b5;
  if ((uint)((int)lVar45 * 4) + uVar20 < position) {
    uVar29 = uVar30 + 0x11;
    if (uVar2 - 4 <= uVar30 + 0x11) {
      uVar29 = uVar2 - 4;
    }
    if (uVar29 <= position) goto LAB_01bee5b5;
    pvVar10 = (hasher->privat)._H40.extra[0];
    pvVar11 = (hasher->privat)._H40.extra[1];
    uVar33 = (hasher->privat)._H42.free_slot_idx[0];
    do {
      uVar51 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar30 = (ulong)uVar51;
      uVar21 = position - *(uint *)((long)pvVar10 + uVar30 * 4);
      *(char *)((long)pvVar10 + (position & 0xffff) + 0x30000) = (char)uVar51;
      if (0xfffe < uVar21) {
        uVar21 = 0xffff;
      }
      uVar16 = uVar33 + 1;
      *(short *)((long)pvVar11 + (ulong)uVar33 * 4) = (short)uVar21;
      *(undefined2 *)((long)pvVar11 + (ulong)uVar33 * 4 + 2) =
           *(undefined2 *)((long)pvVar10 + uVar30 * 2 + 0x20000);
      *(int *)((long)pvVar10 + uVar30 * 4) = (int)position;
      *(ushort *)((long)pvVar10 + uVar30 * 2 + 0x20000) = uVar33;
      local_100 = local_100 + 4;
      position = position + 4;
      uVar33 = uVar16;
    } while (position < uVar29);
  }
  else {
    uVar29 = uVar30 + 9;
    if (uVar6 <= uVar30 + 9) {
      uVar29 = uVar6;
    }
    if (uVar29 <= position) goto LAB_01bee5b5;
    pvVar10 = (hasher->privat)._H40.extra[0];
    pvVar11 = (hasher->privat)._H40.extra[1];
    uVar33 = (hasher->privat)._H42.free_slot_idx[0];
    do {
      uVar51 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar30 = (ulong)uVar51;
      uVar21 = position - *(uint *)((long)pvVar10 + uVar30 * 4);
      *(char *)((long)pvVar10 + (position & 0xffff) + 0x30000) = (char)uVar51;
      if (0xfffe < uVar21) {
        uVar21 = 0xffff;
      }
      uVar16 = uVar33 + 1;
      *(short *)((long)pvVar11 + (ulong)uVar33 * 4) = (short)uVar21;
      *(undefined2 *)((long)pvVar11 + (ulong)uVar33 * 4 + 2) =
           *(undefined2 *)((long)pvVar10 + uVar30 * 2 + 0x20000);
      *(int *)((long)pvVar10 + uVar30 * 4) = (int)position;
      *(ushort *)((long)pvVar10 + uVar30 * 2 + 0x20000) = uVar33;
      local_100 = local_100 + 2;
      position = position + 2;
      uVar33 = uVar16;
    } while (position < uVar29);
  }
LAB_01bee593:
  (hasher->privat)._H42.free_slot_idx[0] = uVar16;
LAB_01bee5b5:
  uVar30 = position;
  if (uVar2 <= position + 4) goto LAB_01bee623;
  goto LAB_01bed238;
code_r0x01bed529:
  lVar36 = lVar36 + 8;
  lVar44 = local_138 + lVar18;
  lVar18 = lVar18 + -8;
  if (lVar44 - 8U < 8) goto code_r0x01bed543;
  goto LAB_01bed51c;
code_r0x01bed543:
  puVar54 = puVar25 + -lVar18;
  puVar31 = (ulong *)((long)puVar3 - lVar18);
  uVar34 = lVar18 + local_138;
LAB_01bed559:
  if (uVar34 != 0) {
    uVar32 = 0;
    do {
      uVar15 = uVar32;
      if (puVar54[uVar32] != *(uint8_t *)((long)puVar31 + uVar32)) break;
      uVar32 = uVar32 + 1;
      uVar15 = uVar34;
    } while (uVar34 != uVar32);
    puVar54 = puVar54 + uVar15;
  }
  uVar34 = (long)puVar54 - (long)puVar25;
LAB_01bed5a8:
  if (3 < uVar34) {
    iVar28 = 0x1f;
    if ((uint)uVar39 != 0) {
      for (; (uint)uVar39 >> iVar28 == 0; iVar28 = iVar28 + -1) {
      }
    }
    uVar32 = (ulong)(iVar28 * -0x1e + 0x780) + uVar34 * 0x87;
    if (local_f8 < uVar32) {
      uVar19 = uVar34;
      uVar46 = uVar34;
      local_168 = uVar39;
      local_f8 = uVar32;
    }
  }
LAB_01bed5db:
  uVar34 = (ulong)uVar33;
  uVar33 = *(ushort *)((long)pvVar11 + uVar34 * 4 + 2);
  uVar34 = (ulong)*(ushort *)((long)pvVar11 + uVar34 * 4);
  sVar55 = sVar55 - 1;
  if (sVar55 == 0) goto LAB_01bed5f7;
  goto LAB_01bed4b2;
code_r0x01bed729:
  puVar26 = puVar26 + 1;
  puVar31 = puVar31 + 1;
  lVar18 = uVar17 + lVar36;
  lVar36 = lVar36 + -8;
  if (lVar18 - 8U < 8) goto code_r0x01bed743;
  goto LAB_01bed71e;
code_r0x01bed743:
  uVar24 = lVar36 + uVar17;
  if (lVar36 + uVar17 != 0) {
LAB_01bed750:
    uVar38 = 0;
    do {
      uVar34 = uVar38;
      if (*(char *)((long)puVar31 + uVar38) != *(char *)((long)puVar26 + uVar38)) break;
      uVar38 = uVar38 + 1;
      uVar34 = uVar24;
    } while (uVar24 != uVar38);
    puVar31 = (ulong *)((long)puVar31 + uVar34);
  }
  uVar24 = (long)puVar31 - (long)puVar3;
LAB_01bed7af:
  if (((uVar24 != 0) && (uVar17 < pBVar9->cutoffTransformsCount + uVar24)) &&
     (uVar17 = (ulong)pBVar9->hash_table_words[uVar46] + uVar21 + lVar1 +
               ((ulong)((uint)(pBVar9->cutoffTransforms >>
                              ((char)(uVar17 - uVar24) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar17 - uVar24) * 4 << (pBVar13->size_bits_by_length[uVar17] & 0x3f)),
     uVar17 <= uVar49)) {
    iVar28 = 0x1f;
    if ((uint)uVar17 != 0) {
      for (; (uint)uVar17 >> iVar28 == 0; iVar28 = iVar28 + -1) {
      }
    }
    uVar38 = (uVar24 * 0x87 - (ulong)(uint)(iVar28 * 0x1e)) + 0x780;
    if (local_f8 <= uVar38) {
      local_10c = (uint)bVar22 - (int)uVar24;
      local_f0 = local_f0 + 1;
      pHVar12->dict_num_matches = local_f0;
      uVar19 = uVar24;
      local_168 = uVar17;
      local_f8 = uVar38;
    }
  }
LAB_01bed85a:
  uVar46 = uVar46 + 1;
  bVar14 = !bVar35;
  bVar35 = false;
  if (bVar14) goto LAB_01bed889;
  goto LAB_01bed6c2;
code_r0x01beda65:
  lVar44 = lVar44 + 8;
  lVar4 = lVar36 + lVar47;
  lVar47 = lVar47 + -8;
  if (lVar4 - 8U < 8) goto code_r0x01beda7b;
  goto LAB_01beda58;
code_r0x01beda7b:
  puVar54 = puVar25 + -lVar47;
  puVar31 = (ulong *)((long)puVar3 - lVar47);
  uVar24 = lVar47 + lVar36;
LAB_01beda8a:
  if (uVar24 != 0) {
    uVar34 = 0;
    do {
      uVar39 = uVar34;
      if (puVar54[uVar34] != *(uint8_t *)((long)puVar31 + uVar34)) break;
      uVar34 = uVar34 + 1;
      uVar39 = uVar24;
    } while (uVar24 != uVar34);
    puVar54 = puVar54 + uVar39;
  }
  uVar24 = (long)puVar54 - (long)puVar25;
LAB_01bedacf:
  if ((1 < uVar24) && (uVar34 = uVar24 * 0x87 + 0x78f, uVar46 < uVar34)) {
    if (lVar18 != 0) {
      uVar34 = uVar34 - ((0x1ca10U >> ((byte)lVar18 & 0xe) & 0xe) + 0x27);
    }
    if (uVar46 < uVar34) {
      uVar46 = uVar34;
      local_160 = uVar24;
      local_158 = uVar24;
      local_150 = uVar38;
    }
  }
LAB_01bedb26:
  lVar18 = lVar18 + 1;
  if (lVar18 == 10) goto code_r0x01bedb33;
  goto LAB_01beda05;
code_r0x01bedb33:
  uVar24 = (ulong)uVar51;
  sVar55 = (hasher->privat)._H5.block_size_;
  uVar38 = uVar29 - *(uint *)((long)pvVar10 + uVar24 * 4);
  if (sVar55 != 0) {
    uVar16 = *(ushort *)((long)pvVar10 + uVar24 * 2 + 0x20000);
    uVar39 = 0;
    uVar34 = uVar38;
LAB_01bedb75:
    uVar39 = uVar34 + uVar39;
    if (uVar39 <= uVar21) {
      if (uVar17 + local_158 <= ringbuffer_mask) {
        uVar32 = uVar29 - uVar39 & ringbuffer_mask;
        uVar34 = uVar32 + local_158;
        if ((ringbuffer_mask < uVar34) || (ringbuffer[uVar17 + local_158] != ringbuffer[uVar34]))
        goto LAB_01bedc43;
        puVar25 = ringbuffer + uVar32;
        uVar34 = local_138;
        puVar54 = puVar25;
        puVar31 = puVar3;
        if (7 < local_138) {
          lVar44 = 0;
          lVar18 = 0;
LAB_01bedbdd:
          if (*(ulong *)((long)puVar3 + lVar44) == *(ulong *)(puVar25 + lVar44))
          goto code_r0x01bedbea;
          uVar32 = *(ulong *)(puVar25 + lVar44) ^ *(ulong *)((long)puVar3 + lVar44);
          uVar34 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
            }
          }
          uVar34 = (uVar34 >> 3 & 0x1fffffff) - lVar18;
          goto LAB_01bedc70;
        }
        goto LAB_01bedc0f;
      }
      goto LAB_01bedc43;
    }
  }
LAB_01bedcba:
  (hasher->privat)._H42.free_slot_idx[0] = uVar33 + 1;
  *(char *)((long)pvVar10 + (uVar29 & 0xffff) + 0x30000) = cVar50;
  if (0xfffe < uVar38) {
    uVar38 = 0xffff;
  }
  *(short *)((long)pvVar11 + (ulong)uVar33 * 4) = (short)uVar38;
  *(undefined2 *)((long)pvVar11 + (ulong)uVar33 * 4 + 2) =
       *(undefined2 *)((long)pvVar10 + uVar24 * 2 + 0x20000);
  *(int *)((long)pvVar10 + uVar24 * 4) = (int)uVar29;
  *(ushort *)((long)pvVar10 + uVar24 * 2 + 0x20000) = uVar33;
  if (uVar46 == 0x7e4) {
    pHVar12 = (hasher->privat)._H5.common_;
    uVar21 = pHVar12->dict_num_lookups;
    local_e8 = pHVar12->dict_num_matches;
    uVar46 = 0x7e4;
    if (uVar21 >> 7 <= local_e8) {
      uVar17 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar54 = pBVar9->hash_table_lengths;
      iVar28 = 0;
      uVar46 = 0x7e4;
      bVar35 = true;
LAB_01bede25:
      uVar21 = uVar21 + 1;
      pHVar12->dict_num_lookups = uVar21;
      bVar22 = puVar54[uVar17];
      uVar24 = (ulong)bVar22;
      if ((uVar24 != 0) && (uVar24 <= local_138)) {
        pBVar13 = pBVar9->words;
        puVar26 = (ulong *)(pBVar13->data +
                           (ulong)pBVar13->offsets_by_length[uVar24] +
                           pBVar9->hash_table_words[uVar17] * uVar24);
        uVar38 = uVar24;
        puVar31 = puVar3;
        if (7 < bVar22) {
          lVar18 = 0;
          puVar53 = puVar3;
LAB_01bede9f:
          if (*puVar26 == *puVar53) goto code_r0x01bedeab;
          uVar34 = *puVar53 ^ *puVar26;
          uVar38 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
            }
          }
          uVar38 = (uVar38 >> 3 & 0x1fffffff) - lVar18;
          goto LAB_01bedf07;
        }
        goto LAB_01beded2;
      }
      goto LAB_01bede4d;
    }
  }
  iVar28 = 0;
LAB_01bedd68:
  if (uVar46 < local_f8 + 0xaf) {
    local_150 = local_168;
    uVar29 = uVar30;
    local_160 = uVar19;
    iVar28 = local_10c;
    sVar55 = local_100;
    local_b8 = uVar30 + sVar7;
    if (uVar43 <= uVar30 + sVar7) {
      local_b8 = uVar43;
    }
    goto LAB_01bee216;
  }
  sVar55 = uVar20;
  if (local_c4 == 3) goto LAB_01bee216;
  local_100 = local_100 + 1;
  local_c4 = local_c4 + 1;
  uVar21 = uVar30 + 5;
  lVar36 = lVar36 + -1;
  uVar30 = uVar29;
  local_168 = local_150;
  uVar19 = local_160;
  local_f8 = uVar46;
  local_10c = iVar28;
  sVar55 = local_100;
  uVar33 = uVar33 + 1;
  if (uVar2 <= uVar21) goto LAB_01bee216;
  goto LAB_01bed8e3;
code_r0x01bedbea:
  lVar44 = lVar44 + 8;
  lVar47 = lVar36 + lVar18;
  lVar18 = lVar18 + -8;
  if (lVar47 - 8U < 8) goto code_r0x01bedc00;
  goto LAB_01bedbdd;
code_r0x01bedc00:
  puVar54 = puVar25 + -lVar18;
  puVar31 = (ulong *)((long)puVar3 - lVar18);
  uVar34 = lVar18 + lVar36;
LAB_01bedc0f:
  puVar48 = puVar54;
  if (uVar34 != 0) {
    puVar48 = puVar54 + uVar34;
    uVar32 = 0;
    do {
      if (puVar54[uVar32] != *(uint8_t *)((long)puVar31 + uVar32)) {
        puVar48 = puVar54 + uVar32;
        break;
      }
      uVar32 = uVar32 + 1;
    } while (uVar34 != uVar32);
  }
  uVar34 = (long)puVar48 - (long)puVar25;
LAB_01bedc70:
  if (3 < uVar34) {
    iVar28 = 0x1f;
    if ((uint)uVar39 != 0) {
      for (; (uint)uVar39 >> iVar28 == 0; iVar28 = iVar28 + -1) {
      }
    }
    uVar32 = (ulong)(iVar28 * -0x1e + 0x780) + uVar34 * 0x87;
    if (uVar46 < uVar32) {
      uVar46 = uVar32;
      local_160 = uVar34;
      local_158 = uVar34;
      local_150 = uVar39;
    }
  }
LAB_01bedc43:
  uVar34 = (ulong)uVar16;
  uVar16 = *(ushort *)((long)pvVar11 + uVar34 * 4 + 2);
  uVar34 = (ulong)*(ushort *)((long)pvVar11 + uVar34 * 4);
  sVar55 = sVar55 - 1;
  if (sVar55 == 0) goto LAB_01bedcba;
  goto LAB_01bedb75;
code_r0x01bedeab:
  puVar26 = puVar26 + 1;
  puVar53 = puVar53 + 1;
  lVar44 = uVar24 + lVar18;
  lVar18 = lVar18 + -8;
  if (lVar44 - 8U < 8) goto code_r0x01bedec5;
  goto LAB_01bede9f;
code_r0x01bedec5:
  uVar38 = lVar18 + uVar24;
  puVar31 = puVar53;
  if (lVar18 + uVar24 != 0) {
LAB_01beded2:
    puVar53 = (ulong *)(uVar38 + (long)puVar31);
    uVar34 = 0;
    do {
      if (*(char *)((long)puVar31 + uVar34) != *(char *)((long)puVar26 + uVar34)) {
        puVar53 = (ulong *)((long)puVar31 + uVar34);
        break;
      }
      uVar34 = uVar34 + 1;
    } while (uVar38 != uVar34);
  }
  uVar38 = (long)puVar53 - (long)puVar3;
LAB_01bedf07:
  if (((uVar38 != 0) && (uVar24 < pBVar9->cutoffTransformsCount + uVar38)) &&
     (uVar24 = (ulong)pBVar9->hash_table_words[uVar17] + lVar1 + local_b8 +
               ((ulong)((uint)(pBVar9->cutoffTransforms >>
                              ((char)(uVar24 - uVar38) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar24 - uVar38) * 4 << (pBVar13->size_bits_by_length[uVar24] & 0x3f)),
     uVar24 <= uVar49)) {
    iVar37 = 0x1f;
    if ((uint)uVar24 != 0) {
      for (; (uint)uVar24 >> iVar37 == 0; iVar37 = iVar37 + -1) {
      }
    }
    uVar34 = (uVar38 * 0x87 - (ulong)(uint)(iVar37 * 0x1e)) + 0x780;
    if (uVar46 <= uVar34) {
      iVar28 = (uint)bVar22 - (int)uVar38;
      local_e8 = local_e8 + 1;
      pHVar12->dict_num_matches = local_e8;
      uVar46 = uVar34;
      local_150 = uVar24;
      local_160 = uVar38;
    }
  }
LAB_01bede4d:
  uVar17 = uVar17 + 1;
  bVar14 = !bVar35;
  bVar35 = false;
  if (bVar14) goto LAB_01bedd68;
  goto LAB_01bede25;
LAB_01bee216:
  local_100 = sVar55;
  local_b8 = local_b8 + sVar8;
  if (local_b8 < local_150) {
LAB_01bee238:
    uVar20 = local_150 + 0xf;
LAB_01bee23c:
    if ((local_150 <= local_b8) && (uVar20 != 0)) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      iVar37 = (int)local_150;
      *dist_cache = iVar37;
      dist_cache[4] = iVar37 + -1;
      dist_cache[5] = iVar37 + 1;
      dist_cache[6] = iVar37 + -2;
      dist_cache[7] = iVar37 + 2;
      dist_cache[8] = iVar37 + -3;
      dist_cache[9] = iVar37 + 3;
    }
  }
  else {
    if (local_150 != (long)*dist_cache) {
      uVar20 = 1;
      if (local_150 != (long)dist_cache[1]) {
        uVar20 = (local_150 + 3) - (long)*dist_cache;
        if (uVar20 < 7) {
          bVar22 = (byte)((int)uVar20 << 2);
          uVar51 = 0x9750468;
        }
        else {
          uVar20 = (local_150 + 3) - (long)dist_cache[1];
          if (6 < uVar20) {
            uVar20 = 2;
            if ((local_150 != (long)dist_cache[2]) && (uVar20 = 3, local_150 != (long)dist_cache[3])
               ) goto LAB_01bee238;
            goto LAB_01bee23c;
          }
          bVar22 = (byte)((int)uVar20 << 2);
          uVar51 = 0xfdb1ace;
        }
        uVar20 = (ulong)(uVar51 >> (bVar22 & 0x1f) & 0xf);
      }
      goto LAB_01bee23c;
    }
    uVar20 = 0;
  }
  uVar51 = (uint)local_100;
  local_d8->insert_len_ = uVar51;
  local_d8->copy_len_ = iVar28 << 0x19 | (uint)local_160;
  uVar21 = (ulong)(params->dist).num_direct_distance_codes;
  uVar30 = uVar21 + 0x10;
  uVar41 = 0;
  if (uVar30 <= uVar20) {
    uVar52 = (params->dist).distance_postfix_bits;
    bVar22 = (byte)uVar52;
    uVar21 = ((uVar20 - uVar21) + (4L << (bVar22 & 0x3f))) - 0x10;
    uVar27 = 0x1f;
    uVar42 = (uint)uVar21;
    if (uVar42 != 0) {
      for (; uVar42 >> uVar27 == 0; uVar27 = uVar27 - 1) {
      }
    }
    uVar27 = (uVar27 ^ 0xffffffe0) + 0x1f;
    uVar49 = (ulong)((uVar21 >> ((ulong)uVar27 & 0x3f) & 1) != 0);
    lVar36 = (ulong)uVar27 - (ulong)uVar52;
    uVar20 = (~(-1 << (bVar22 & 0x1f)) & uVar42) + uVar30 +
             (uVar49 + lVar36 * 2 + 0xfffe << (bVar22 & 0x3f)) | lVar36 * 0x400;
    uVar41 = (uint32_t)(uVar21 - (uVar49 + 2 << ((byte)uVar27 & 0x3f)) >> (bVar22 & 0x3f));
  }
  local_d8->dist_prefix_ = (uint16_t)uVar20;
  local_d8->dist_extra_ = uVar41;
  if (5 < local_100) {
    if (local_100 < 0x82) {
      uVar51 = 0x1f;
      uVar52 = (uint)(local_100 - 2);
      if (uVar52 != 0) {
        for (; uVar52 >> uVar51 == 0; uVar51 = uVar51 - 1) {
        }
      }
      uVar51 = (int)(local_100 - 2 >> ((char)(uVar51 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar51 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_100 < 0x842) {
      uVar52 = 0x1f;
      if (uVar51 - 0x42 != 0) {
        for (; uVar51 - 0x42 >> uVar52 == 0; uVar52 = uVar52 - 1) {
        }
      }
      uVar51 = (uVar52 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar51 = 0x15;
      if (0x1841 < local_100) {
        uVar51 = (uint)(ushort)(0x17 - (local_100 < 0x5842));
      }
    }
  }
  uVar52 = iVar28 + (uint)local_160;
  if (uVar52 < 10) {
    uVar27 = uVar52 - 2;
  }
  else if (uVar52 < 0x86) {
    uVar52 = uVar52 - 6;
    uVar27 = 0x1f;
    if (uVar52 != 0) {
      for (; uVar52 >> uVar27 == 0; uVar27 = uVar27 - 1) {
      }
    }
    uVar27 = (uVar52 >> ((char)(uVar27 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar27 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar27 = 0x17;
    if (uVar52 < 0x846) {
      uVar27 = 0x1f;
      if (uVar52 - 0x46 != 0) {
        for (; uVar52 - 0x46 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      uVar27 = (uVar27 ^ 0xffe0) + 0x2c;
    }
  }
  uVar33 = (ushort)uVar27;
  uVar40 = (uVar33 & 7) + ((ushort)uVar51 & 7) * 8;
  if ((((uVar20 & 0x3ff) == 0) && ((ushort)uVar51 < 8)) && (uVar33 < 0x10)) {
    if (7 < uVar33) {
      uVar40 = uVar40 + 0x40;
    }
  }
  else {
    iVar28 = ((uVar51 & 0xffff) >> 3) * 3 + ((uVar27 & 0xffff) >> 3);
    uVar40 = uVar40 + ((ushort)(0x520d40 >> ((char)iVar28 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar28 * 0x40 + 0x40;
  }
  local_d8->cmd_prefix_ = uVar40;
  *num_literals = *num_literals + local_100;
  position = uVar29 + local_160;
  uVar30 = sVar23;
  if (position < sVar23) {
    uVar30 = position;
  }
  uVar21 = uVar29 + 2;
  if (local_150 < local_160 >> 2) {
    uVar20 = position + local_150 * -4;
    if (uVar20 < uVar21) {
      uVar20 = uVar21;
    }
    uVar21 = uVar20;
    if (uVar30 < uVar20) {
      uVar21 = uVar30;
    }
  }
  uVar20 = uVar29 + lVar45 + local_160 * 2;
  local_d8 = local_d8 + 1;
  if (uVar30 <= uVar21) {
    local_100 = 0;
    goto LAB_01bee5b5;
  }
  pvVar10 = (hasher->privat)._H40.extra[0];
  pvVar11 = (hasher->privat)._H40.extra[1];
  uVar33 = (hasher->privat)._H42.free_slot_idx[0];
  do {
    uVar51 = (uint)(*(int *)(ringbuffer + (uVar21 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar29 = (ulong)uVar51;
    uVar49 = uVar21 - *(uint *)((long)pvVar10 + uVar29 * 4);
    *(char *)((long)pvVar10 + (uVar21 & 0xffff) + 0x30000) = (char)uVar51;
    if (0xfffe < uVar49) {
      uVar49 = 0xffff;
    }
    uVar16 = uVar33 + 1;
    *(short *)((long)pvVar11 + (ulong)uVar33 * 4) = (short)uVar49;
    *(undefined2 *)((long)pvVar11 + (ulong)uVar33 * 4 + 2) =
         *(undefined2 *)((long)pvVar10 + uVar29 * 2 + 0x20000);
    *(int *)((long)pvVar10 + uVar29 * 4) = (int)uVar21;
    *(ushort *)((long)pvVar10 + uVar29 * 2 + 0x20000) = uVar33;
    uVar21 = uVar21 + 1;
    uVar33 = uVar16;
  } while (uVar30 != uVar21);
  local_100 = 0;
  goto LAB_01bee593;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}